

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Parameters *
vkt::api::anon_unknown_1::PipelineLayout::Parameters::singleDescriptorSet
          (Parameters *__return_storage_ptr__,Parameters *descriptorSetLayout)

{
  Parameters *descriptorSetLayout_local;
  Parameters *params;
  
  Parameters(__return_storage_ptr__);
  std::
  vector<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters,_std::allocator<vkt::api::(anonymous_namespace)::DescriptorSetLayout::Parameters>_>
  ::push_back(&__return_storage_ptr__->descriptorSetLayouts,descriptorSetLayout);
  return __return_storage_ptr__;
}

Assistant:

static Parameters singleDescriptorSet (const DescriptorSetLayout::Parameters& descriptorSetLayout)
		{
			Parameters params;
			params.descriptorSetLayouts.push_back(descriptorSetLayout);
			return params;
		}